

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode cf_h2_keep_alive(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  cf_h2_ctx *ctx;
  CURLcode CVar5;
  
  puVar1 = (undefined8 *)cf->ctx;
  uVar2 = puVar1[2];
  puVar1[2] = data;
  CVar5 = CURLE_OK;
  uVar3 = nghttp2_submit_ping((nghttp2_session *)*puVar1,'\0',(uint8_t *)0x0);
  if (uVar3 == 0) {
    uVar3 = nghttp2_session_send((nghttp2_session *)*puVar1);
    if (uVar3 != 0) {
      pcVar4 = nghttp2_strerror(uVar3);
      Curl_failf(data,"nghttp2_session_send() failed: %s(%d)",pcVar4,(ulong)uVar3);
      CVar5 = CURLE_SEND_ERROR;
    }
  }
  else {
    pcVar4 = nghttp2_strerror(uVar3);
    Curl_failf(data,"nghttp2_submit_ping() failed: %s(%d)",pcVar4,(ulong)uVar3);
    CVar5 = CURLE_HTTP2;
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar2;
  return CVar5;
}

Assistant:

static CURLcode cf_h2_keep_alive(struct Curl_cfilter *cf,
                                 struct Curl_easy *data)
{
  CURLcode result;
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  result = http2_send_ping(cf, data);
  CF_DATA_RESTORE(cf, save);
  return result;
}